

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall Assimp::IFC::Schema_2x3::IfcMember::IfcMember(IfcMember *this)

{
  IfcMember *this_local;
  
  STEP::Object::Object((Object *)&(this->super_IfcBuildingElement).field_0x158,"IfcMember");
  IfcBuildingElement::IfcBuildingElement
            (&this->super_IfcBuildingElement,&PTR_construction_vtable_24__00f772c0);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcMember,_0UL>::ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcMember,_0UL> *)
             &(this->super_IfcBuildingElement).super_IfcElement.field_0x148,
             &PTR_construction_vtable_24__00f773f8);
  *(undefined8 *)&(this->super_IfcBuildingElement).super_IfcElement.super_IfcProduct.super_IfcObject
       = 0xf77190;
  *(undefined8 *)&(this->super_IfcBuildingElement).field_0x158 = 0xf772a8;
  *(undefined8 *)
   &(this->super_IfcBuildingElement).super_IfcElement.super_IfcProduct.super_IfcObject.field_0x88 =
       0xf771b8;
  (this->super_IfcBuildingElement).super_IfcElement.super_IfcProduct.super_IfcObject.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>._vptr_ObjectHelper =
       (_func_int **)0xf771e0;
  *(undefined8 *)
   &(this->super_IfcBuildingElement).super_IfcElement.super_IfcProduct.super_IfcObject.field_0xd0 =
       0xf77208;
  *(undefined8 *)&(this->super_IfcBuildingElement).super_IfcElement.super_IfcProduct.field_0x100 =
       0xf77230;
  *(undefined8 *)&(this->super_IfcBuildingElement).super_IfcElement.field_0x138 = 0xf77258;
  *(undefined8 *)&(this->super_IfcBuildingElement).super_IfcElement.field_0x148 = 0xf77280;
  return;
}

Assistant:

IfcMember() : Object("IfcMember") {}